

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::Symbol::
visit<slang::ast::TypePrinter&,std::basic_string_view<char,std::char_traits<char>>>
          (Symbol *this,TypePrinter *visitor,basic_string_view<char,_std::char_traits<char>_> *args)

{
  SymbolKind SVar1;
  string_view overrideName;
  string_view overrideName_00;
  string_view overrideName_01;
  string_view overrideName_02;
  string_view overrideName_03;
  string_view overrideName_04;
  logic_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  char *end;
  char *begin;
  FormatBuffer *this_01;
  string_view sVar5;
  string_view sVar6;
  string_view sVar7;
  string_view sVar8;
  string_view sVar9;
  string_view sVar10;
  string_view sVar11;
  string_view sVar12;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  SVar1 = this->kind;
  if ((ulong)SVar1 < 0x5a) {
    sVar5._M_str = (char *)((long)&switchD_003e2094::switchdataD_00436b78 +
                           (long)(int)(&switchD_003e2094::switchdataD_00436b78)[SVar1]);
    switch(SVar1) {
    default:
      return;
    case PredefinedIntegerType:
      sVar10._M_str = sVar5._M_str;
      sVar10._M_len = (size_t)args;
      TypePrinter::visit(visitor,(PredefinedIntegerType *)this,sVar10);
      return;
    case ScalarType:
      sVar11._M_str = sVar5._M_str;
      sVar11._M_len = (size_t)args;
      TypePrinter::visit(visitor,(ScalarType *)this,sVar11);
      return;
    case FloatingType:
    case ClassType:
    case CovergroupType:
    case VoidType:
    case NullType:
    case CHandleType:
    case StringType:
    case EventType:
    case UnboundedType:
    case TypeRefType:
    case UntypedType:
    case SequenceType:
    case PropertyType:
      this_01 = (visitor->buffer)._M_t.
                super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      begin = (this->name)._M_str;
      end = begin + (this->name)._M_len;
      break;
    case EnumType:
      overrideName_03._M_len = args->_M_len;
      overrideName_03._M_str = args->_M_str;
      TypePrinter::visit(visitor,(EnumType *)this,overrideName_03);
      return;
    case PackedArrayType:
      sVar7._M_str = sVar5._M_str;
      sVar7._M_len = (size_t)args;
      TypePrinter::visit(visitor,(PackedArrayType *)this,sVar7);
      return;
    case FixedSizeUnpackedArrayType:
      sVar9._M_str = sVar5._M_str;
      sVar9._M_len = (size_t)args;
      TypePrinter::visit(visitor,(FixedSizeUnpackedArrayType *)this,sVar9);
      return;
    case DynamicArrayType:
      sVar12._M_str = sVar5._M_str;
      sVar12._M_len = (size_t)args;
      TypePrinter::visit(visitor,(DynamicArrayType *)this,sVar12);
      return;
    case AssociativeArrayType:
      sVar6._M_str = sVar5._M_str;
      sVar6._M_len = (size_t)args;
      TypePrinter::visit(visitor,(AssociativeArrayType *)this,sVar6);
      return;
    case QueueType:
      sVar5._M_len = (size_t)args;
      TypePrinter::visit(visitor,(QueueType *)this,sVar5);
      return;
    case PackedStructType:
      overrideName_02._M_len = args->_M_len;
      overrideName_02._M_str = args->_M_str;
      TypePrinter::visit(visitor,(PackedStructType *)this,overrideName_02);
      return;
    case UnpackedStructType:
      overrideName_01._M_len = args->_M_len;
      overrideName_01._M_str = args->_M_str;
      TypePrinter::visit(visitor,(UnpackedStructType *)this,overrideName_01);
      return;
    case PackedUnionType:
      overrideName._M_len = args->_M_len;
      overrideName._M_str = args->_M_str;
      TypePrinter::visit(visitor,(PackedUnionType *)this,overrideName);
      return;
    case UnpackedUnionType:
      overrideName_00._M_len = args->_M_len;
      overrideName_00._M_str = args->_M_str;
      TypePrinter::visit(visitor,(UnpackedUnionType *)this,overrideName_00);
      return;
    case VirtualInterfaceType:
      sVar8._M_str = sVar5._M_str;
      sVar8._M_len = (size_t)args;
      TypePrinter::visit(visitor,(VirtualInterfaceType *)this,sVar8);
      return;
    case TypeAlias:
      overrideName_04._M_len = args->_M_len;
      overrideName_04._M_str = args->_M_str;
      TypePrinter::visit(visitor,(TypeAliasType *)this,overrideName_04);
      return;
    case ErrorType:
      this_01 = (visitor->buffer)._M_t.
                super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                ._M_t.
                super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
                .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
      begin = "<error>";
      end = "";
    }
    fmt::v9::detail::buffer<char>::append<char>((buffer<char> *)this_01,begin,end);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
             ,"");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
    local_b0.field_2._M_allocated_capacity = *psVar3;
    local_b0.field_2._8_8_ = plVar2[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar3;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_70,0xe4);
  std::operator+(&local_50,&local_b0,&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_90 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_f0 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_f0 == plVar4) {
    local_e0 = *plVar4;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar4;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

decltype(auto) Symbol::visit(TVisitor&& visitor, Args&&... args) const {
    // clang-format off
#define SYMBOL(k) case SymbolKind::k: return visitor.visit(*static_cast<const k##Symbol*>(this), std::forward<Args>(args)...)
#define TYPE(k) case SymbolKind::k: return visitor.visit(*static_cast<const k*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case SymbolKind::Unknown: return visitor.visit(*this, std::forward<Args>(args)...);
        case SymbolKind::DeferredMember: return visitor.visit(*this, std::forward<Args>(args)...);
        case SymbolKind::TypeAlias: return visitor.visit(*static_cast<const TypeAliasType*>(this), std::forward<Args>(args)...);
        SYMBOL(Root);
        SYMBOL(CompilationUnit);
        SYMBOL(Attribute);
        SYMBOL(TransparentMember);
        SYMBOL(EmptyMember);
        SYMBOL(EnumValue);
        SYMBOL(ForwardingTypedef);
        SYMBOL(Parameter);
        SYMBOL(TypeParameter);
        SYMBOL(Port);
        SYMBOL(MultiPort);
        SYMBOL(InterfacePort);
        SYMBOL(Instance);
        SYMBOL(InstanceBody);
        SYMBOL(InstanceArray);
        SYMBOL(Package);
        SYMBOL(ExplicitImport);
        SYMBOL(WildcardImport);
        SYMBOL(GenerateBlock);
        SYMBOL(GenerateBlockArray);
        SYMBOL(ProceduralBlock);
        SYMBOL(StatementBlock);
        SYMBOL(Net);
        SYMBOL(Variable);
        SYMBOL(FormalArgument);
        SYMBOL(Field);
        SYMBOL(ClassProperty);
        SYMBOL(Subroutine);
        SYMBOL(Modport);
        SYMBOL(ModportPort);
        SYMBOL(ModportClocking);
        SYMBOL(ContinuousAssign);
        SYMBOL(Genvar);
        SYMBOL(ElabSystemTask);
        SYMBOL(GenericClassDef);
        SYMBOL(MethodPrototype);
        SYMBOL(UnknownModule);
        SYMBOL(Iterator);
        SYMBOL(PatternVar);
        SYMBOL(ConstraintBlock);
        SYMBOL(DefParam);
        SYMBOL(Specparam);
        SYMBOL(Primitive);
        SYMBOL(PrimitivePort);
        SYMBOL(PrimitiveInstance);
        SYMBOL(SpecifyBlock);
        SYMBOL(Sequence);
        SYMBOL(Property);
        SYMBOL(AssertionPort);
        SYMBOL(ClockingBlock);
        SYMBOL(ClockVar);
        SYMBOL(LocalAssertionVar);
        SYMBOL(LetDecl);
        SYMBOL(RandSeqProduction);
        SYMBOL(CovergroupBody);
        SYMBOL(Coverpoint);
        SYMBOL(CoverCross);
        SYMBOL(CoverCrossBody);
        SYMBOL(CoverageBin);
        TYPE(PredefinedIntegerType);
        TYPE(ScalarType);
        TYPE(FloatingType);
        TYPE(EnumType);
        TYPE(PackedArrayType);
        TYPE(FixedSizeUnpackedArrayType);
        TYPE(DynamicArrayType);
        TYPE(AssociativeArrayType);
        TYPE(QueueType);
        TYPE(PackedStructType);
        TYPE(UnpackedStructType);
        TYPE(PackedUnionType);
        TYPE(UnpackedUnionType);
        TYPE(ClassType);
        TYPE(CovergroupType);
        TYPE(VoidType);
        TYPE(NullType);
        TYPE(CHandleType);
        TYPE(StringType);
        TYPE(EventType);
        TYPE(UnboundedType);
        TYPE(TypeRefType);
        TYPE(UntypedType);
        TYPE(SequenceType);
        TYPE(PropertyType);
        TYPE(VirtualInterfaceType);
        TYPE(ErrorType);
        TYPE(NetType);
    }
#undef TYPE
#undef SYMBOL
    // clang-format on
    ASSUME_UNREACHABLE;
}